

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

argParserAdvancedConfiguration * __thiscall
argvParser::addArg(argvParser *this,string *argvShort,string *argvLong,string *help,
                  function<void_()> *callBack)

{
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *this_00;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *this_01;
  bool bVar1;
  section *this_02;
  reference ppsVar2;
  argument *this_03;
  byte local_1b1;
  byte local_1a1;
  function<void_()> local_168;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  argument *local_e8;
  section *local_e0;
  byte local_d1;
  string local_d0 [32];
  string local_b0 [39];
  byte local_89;
  string local_88 [48];
  string local_58 [32];
  function<void_()> *local_38;
  function<void_()> *callBack_local;
  string *help_local;
  string *argvLong_local;
  string *argvShort_local;
  argvParser *this_local;
  
  local_38 = callBack;
  callBack_local = (function<void_()> *)help;
  help_local = argvLong;
  argvLong_local = argvShort;
  argvShort_local = (string *)this;
  std::__cxx11::string::string(local_58,(string *)argvShort);
  local_89 = 0;
  bVar1 = argParserAdvancedConfiguration::existArg
                    (&this->super_argParserAdvancedConfiguration,(string *)local_58);
  local_1a1 = 0;
  if (!bVar1) {
    std::__cxx11::string::string(local_88,(string *)argvLong);
    local_89 = 1;
    bVar1 = argParserAdvancedConfiguration::existArg
                      (&this->super_argParserAdvancedConfiguration,(string *)local_88);
    local_1a1 = bVar1 ^ 0xff;
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string(local_58);
  if ((local_1a1 & 1) == 0) {
    this_local = (argvParser *)0x0;
  }
  else {
    std::__cxx11::string::string(local_b0,(string *)argvShort);
    local_d1 = 0;
    bVar1 = argParserAdvancedConfiguration::existArg
                      (&this->super_argParserAdvancedConfiguration,(string *)local_b0);
    local_1b1 = 0;
    if (!bVar1) {
      std::__cxx11::string::string(local_d0,(string *)argvLong);
      local_d1 = 1;
      bVar1 = argParserAdvancedConfiguration::existArg
                        (&this->super_argParserAdvancedConfiguration,(string *)local_d0);
      local_1b1 = bVar1 ^ 0xff;
    }
    if ((local_d1 & 1) != 0) {
      std::__cxx11::string::~string(local_d0);
    }
    std::__cxx11::string::~string(local_b0);
    if ((local_1b1 & 1) != 0) {
      this_00 = (this->super_argParserAdvancedConfiguration).newargconfig;
      this_02 = (section *)operator_new(0x28);
      *(undefined8 *)&this_02->field_0x10 = 0;
      *(undefined8 *)&this_02->field_0x18 = 0;
      *(undefined8 *)this_02 = 0;
      *(undefined8 *)&this_02->field_0x8 = 0;
      this_02->arguments =
           (vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
            *)0x0;
      argParserAdvancedConfiguration::section::section(this_02);
      local_e0 = this_02;
      std::
      vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      ::push_back(this_00,&local_e0);
    }
    ppsVar2 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::back((this->super_argParserAdvancedConfiguration).newargconfig);
    this_01 = (*ppsVar2)->arguments;
    this_03 = (argument *)operator_new(0xf0);
    std::__cxx11::string::string(local_108,(string *)argvShort);
    std::__cxx11::string::string(local_128,(string *)argvLong);
    std::__cxx11::string::string(local_148,(string *)help);
    std::function<void_()>::function(&local_168,callBack);
    argParserAdvancedConfiguration::argument::argument
              (this_03,(string *)local_108,(string *)local_128,(string *)local_148,&local_168);
    local_e8 = this_03;
    std::
    vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
    ::push_back(this_01,&local_e8);
    std::function<void_()>::~function(&local_168);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_108);
    this_local = this;
  }
  return &this_local->super_argParserAdvancedConfiguration;
}

Assistant:

argParserAdvancedConfiguration * argvParser::addArg(string argvShort, string argvLong, string help, function<void()> callBack) {
    if (!existArg(argvShort) && !existArg(argvLong)) {
        if (!existArg(argvShort) && !existArg(argvLong)) {
            newargconfig->push_back(new section());
        }
        newargconfig->back()->arguments->push_back(new argument(argvShort, argvLong, help, callBack));
        return this;
    }
    return nullptr;
}